

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packets.c
# Opt level: O0

int rtr_store_prefix_pdu
              (rtr_socket *rtr_socket,void *pdu,uint pdu_size,void **ary,uint *ind,uint *size)

{
  pdu_type pVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  pdu_ipv6 *ary_ipv6;
  pdu_ipv4 *ary_ipv4;
  void *tmp;
  pdu_type type;
  uint *size_local;
  uint *ind_local;
  void **ary_local;
  uint pdu_size_local;
  void *pdu_local;
  rtr_socket *rtr_socket_local;
  char local_1f [8];
  char txt [15];
  
  txt._7_8_ = *(undefined8 *)(in_FS_OFFSET + 0x28);
  pVar1 = rtr_get_pdu_type(pdu);
  if ((pVar1 != IPV4_PREFIX) && (pVar1 != IPV6_PREFIX)) {
    __assert_fail("type == IPV4_PREFIX || type == IPV6_PREFIX",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/rtr/packets.c"
                  ,0x348,
                  "int rtr_store_prefix_pdu(struct rtr_socket *, const void *, const unsigned int, void **, unsigned int *, unsigned int *)"
                 );
  }
  if (*size <= *ind) {
    *size = *size + 100;
    pvVar2 = lrtr_realloc(*ary,(ulong)(*size * pdu_size));
    if (pvVar2 == (void *)0x0) {
      builtin_strncpy(local_1f,"Realloc ",8);
      builtin_strncpy(txt,"failed",7);
      lrtr_dbg("RTR Socket: %s",local_1f);
      rtr_send_error_pdu_from_host(rtr_socket,(void *)0x0,0,INTERNAL_ERROR,local_1f,0xf);
      rtr_change_socket_state(rtr_socket,RTR_ERROR_FATAL);
      rtr_socket_local._4_4_ = -1;
      goto LAB_0010df7d;
    }
    *ary = pvVar2;
  }
  if (pVar1 == IPV4_PREFIX) {
    memcpy((void *)((long)*ary + (ulong)*ind * 0x14),pdu,(ulong)pdu_size);
  }
  else if (pVar1 == IPV6_PREFIX) {
    memcpy((void *)((long)*ary + (ulong)*ind * 0x20),pdu,(ulong)pdu_size);
  }
  *ind = *ind + 1;
  rtr_socket_local._4_4_ = 0;
LAB_0010df7d:
  if (*(long *)(in_FS_OFFSET + 0x28) != txt._7_8_) {
    __stack_chk_fail();
  }
  return rtr_socket_local._4_4_;
}

Assistant:

static int rtr_store_prefix_pdu(struct rtr_socket *rtr_socket, const void *pdu, const unsigned int pdu_size, void **ary,
				unsigned int *ind, unsigned int *size)
{
	const enum pdu_type type = rtr_get_pdu_type(pdu);

	assert(type == IPV4_PREFIX || type == IPV6_PREFIX);
	if (*ind >= *size) {
		*size += TEMPORARY_PDU_STORE_INCREMENT_VALUE;
		void *tmp = lrtr_realloc(*ary, *size * pdu_size);

		if (!tmp) {
			const char txt[] = "Realloc failed";

			RTR_DBG("%s", txt);
			rtr_send_error_pdu_from_host(rtr_socket, NULL, 0, INTERNAL_ERROR, txt, sizeof(txt));
			rtr_change_socket_state(rtr_socket, RTR_ERROR_FATAL);
			return RTR_ERROR;
		}
		*ary = tmp;
	}
	if (type == IPV4_PREFIX) {
		struct pdu_ipv4 *ary_ipv4 = *ary;

		memcpy(ary_ipv4 + *ind, pdu, pdu_size);
	} else if (type == IPV6_PREFIX) {
		struct pdu_ipv6 *ary_ipv6 = *ary;

		memcpy(ary_ipv6 + *ind, pdu, pdu_size);
	}
	(*ind)++;
	return RTR_SUCCESS;
}